

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# byteStream.c
# Opt level: O1

void sysbvm_byteStream_nextPut(sysbvm_context_t *context,sysbvm_tuple_t byteStream,uint8_t value)

{
  ulong requiredCapacity;
  ulong uVar1;
  long lVar2;
  sysbvm_tuple_t sVar3;
  
  if ((byteStream & 0xf) == 0 && byteStream != 0) {
    uVar1 = *(ulong *)(byteStream + 0x10);
    if (uVar1 == 0 || (uVar1 & 0xf) != 0) {
      lVar2 = (long)uVar1 >> 4;
    }
    else {
      lVar2 = *(long *)(uVar1 + 0x10);
    }
    uVar1 = *(ulong *)(byteStream + 0x18);
    if ((uVar1 & 0xf) == 0 && uVar1 != 0) {
      uVar1 = (ulong)*(uint *)(uVar1 + 0xc);
    }
    else {
      uVar1 = 0;
    }
    requiredCapacity = lVar2 + 1;
    if (uVar1 < requiredCapacity) {
      sysbvm_byteStream_increaseCapacityToAtLeast(context,byteStream,requiredCapacity);
    }
    *(uint8_t *)(*(long *)(byteStream + 0x18) + 0x10 + lVar2) = value;
    if (lVar2 + 0x800000000000001U >> 0x3c == 0) {
      sVar3 = requiredCapacity * 0x10 | 0xb;
    }
    else {
      sVar3 = sysbvm_tuple_uint64_encodeBig(context,requiredCapacity);
    }
    *(sysbvm_tuple_t *)(byteStream + 0x10) = sVar3;
  }
  return;
}

Assistant:

SYSBVM_API void sysbvm_byteStream_nextPut(sysbvm_context_t *context, sysbvm_tuple_t byteStream, uint8_t value)
{
    if(!sysbvm_tuple_isNonNullPointer(byteStream))
        return;

    sysbvm_byteStream_t *byteStreamObject = (sysbvm_byteStream_t*)byteStream;
    size_t size = sysbvm_tuple_size_decode(byteStreamObject->size);
    size_t capacity = sysbvm_tuple_getSizeInBytes(byteStreamObject->storage);
    size_t requiredCapacity = size + 1;
    if(requiredCapacity > capacity)
        sysbvm_byteStream_increaseCapacityToAtLeast(context, byteStream, requiredCapacity);

    sysbvm_object_tuple_t *storage = (sysbvm_object_tuple_t*)byteStreamObject->storage;
    storage->bytes[size] = value;
    byteStreamObject->size = sysbvm_tuple_size_encode(context, size + 1);

}